

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<float>::UpdateTree(BpTree<float> *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  char *local_78;
  char *p;
  string local_40 [36];
  int local_1c;
  int local_18;
  int BlockNum;
  int s;
  int i;
  BpTree<float> *this_local;
  
  _s = this;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->FileOff_bin);
  local_18 = (int)sVar2;
  std::__cxx11::string::string(local_40,(string *)&this->Index_FileName);
  iVar1 = Buffer::Find(&blocks,(string *)local_40,0);
  std::__cxx11::string::~string(local_40);
  local_1c = iVar1;
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&p,(string *)&this->Index_FileName);
    local_1c = Buffer::Allocate(&blocks,(string *)&p,0);
    std::__cxx11::string::~string((string *)&p);
  }
  lVar4 = (long)local_1c;
  blocks.buffer[lVar4].data[0] = this->Data_Type;
  *(int *)(blocks.buffer[lVar4].data + 1) = this->N;
  *(int *)(blocks.buffer[lVar4].data + 5) = (this->RootAddr).FileOff;
  *(int *)(blocks.buffer[lVar4].data + 9) = this->Current_Off;
  *(int *)(blocks.buffer[lVar4].data + 0xd) = local_18;
  local_78 = blocks.buffer[lVar4].data + 0x11;
  for (BlockNum = 0; BlockNum < local_18 && BlockNum < 1000; BlockNum = BlockNum + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->FileOff_bin);
    *(value_type *)local_78 = *pvVar3;
    local_78 = local_78 + 4;
    std::vector<int,_std::allocator<int>_>::pop_back(&this->FileOff_bin);
  }
  Buffer::Lock(&blocks,local_1c);
  return;
}

Assistant:

void BpTree<K>::UpdateTree(void) {
	int i, s = this->FileOff_bin.size();
	int BlockNum = blocks.Find(this->Index_FileName, 0);
	if (BlockNum == -1) {
		BlockNum = blocks.Allocate(this->Index_FileName, 0);
	}
	char* p = blocks.buffer[BlockNum].data;
	memcpy(p, &this->Data_Type, sizeof(char));
	p += sizeof(char);
	memcpy(p, reinterpret_cast<char*>(&this->N), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->RootAddr.FileOff), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->Current_Off), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&s), sizeof(int));
	p += sizeof(int);
	for (i = 0; i < s && i < 1000; i++) {
		memcpy(p, reinterpret_cast<char*>(&this->FileOff_bin.back()), sizeof(int));
		p += sizeof(int);
		this->FileOff_bin.pop_back();
	}
	blocks.Lock(BlockNum);
}